

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_common_constructors<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*>>>>
               (void)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  undefined4 local_8fc;
  size_type local_8f8;
  basic_cstring<const_char> local_8f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_8e0;
  basic_cstring<const_char> local_8b8;
  basic_cstring<const_char> local_8a8;
  basic_cstring<const_char> local_898;
  basic_cstring<const_char> local_888;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_878;
  vector<bool,_std::allocator<bool>_> local_858;
  vector<bool,_std::allocator<bool>_> local_830;
  assertion_result local_808;
  basic_cstring<const_char> local_7f0;
  basic_cstring<const_char> local_7e0;
  basic_cstring<const_char> local_7d0;
  basic_cstring<const_char> local_7c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7b0;
  vector<bool,_std::allocator<bool>_> local_790;
  vector<bool,_std::allocator<bool>_> local_768;
  assertion_result local_740;
  basic_cstring<const_char> local_728;
  basic_cstring<const_char> local_718;
  undefined4 local_704;
  size_t local_700;
  basic_cstring<const_char> local_6f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_6e8;
  basic_cstring<const_char> local_6c0;
  basic_cstring<const_char> local_6b0;
  undefined4 local_69c;
  size_t local_698;
  basic_cstring<const_char> local_690;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_680;
  basic_cstring<const_char> local_658;
  basic_cstring<const_char> local_648;
  undefined4 local_634;
  size_t local_630;
  basic_cstring<const_char> local_628;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_618;
  basic_cstring<const_char> local_5f0;
  basic_cstring<const_char> local_5e0;
  undefined1 local_5d0 [8];
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  assignCol;
  basic_cstring<const_char> local_588;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_578;
  vector<bool,_std::allocator<bool>_> local_558;
  vector<bool,_std::allocator<bool>_> local_530;
  assertion_result local_508;
  basic_cstring<const_char> local_4f0;
  basic_cstring<const_char> local_4e0;
  undefined4 local_4cc;
  size_t local_4c8;
  basic_cstring<const_char> local_4c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_4b0;
  basic_cstring<const_char> local_488;
  basic_cstring<const_char> local_478;
  undefined4 local_464;
  size_t local_460;
  basic_cstring<const_char> local_458;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_448;
  basic_cstring<const_char> local_420;
  basic_cstring<const_char> local_410;
  undefined1 local_400 [8];
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  moveCol;
  size_t local_3c0;
  basic_cstring<const_char> local_3b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3a8;
  basic_cstring<const_char> local_380;
  basic_cstring<const_char> local_370;
  undefined1 local_360 [8];
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  rowCopyCol;
  size_t local_320;
  basic_cstring<const_char> local_318;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_308;
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0;
  undefined1 local_2c0 [8];
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  copyCol;
  size_t local_280;
  basic_cstring<const_char> local_278;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_268;
  basic_cstring<const_char> local_240;
  basic_cstring<const_char> local_230;
  undefined1 local_220 [8];
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  rowCol;
  vector<int,_std::allocator<int>_> rows;
  size_t local_1c8;
  basic_cstring<const_char> local_1c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1b0;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  undefined1 local_168 [8];
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  col;
  size_t local_128;
  basic_cstring<const_char> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_110;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  undefined1 local_c8 [8];
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  emptyCol;
  uint local_6c [3];
  iterator local_60;
  undefined8 local_58;
  Column_z2_settings local_39;
  undefined1 local_38 [7];
  Column_settings settings;
  Container cont2;
  Container cont1;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &cont2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>
  ::Column_z2_settings::Column_z2_settings(&local_39,5);
  local_6c[0] = 0;
  local_6c[1] = 2;
  local_6c[2] = 4;
  local_60 = local_6c;
  local_58 = 3;
  __l_00._M_len = 3;
  __l_00._M_array = local_60;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &cont2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__l_00);
  emptyCol.entryPool_._4_4_ = 0;
  __l._M_len = 3;
  __l._M_array = (iterator)((long)&emptyCol.entryPool_ + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,__l);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_c8,&local_39);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0xf9,&local_e8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_110,plVar3,(char (*) [1])0x1af121);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_128 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                ::size((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                        *)local_c8);
    col.entryPool_._4_4_ = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_110,&local_120,0xf9,1,2,&local_128,"emptyCol.size()",
               (undefined1 *)((long)&col.entryPool_ + 4),"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_110);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*>>>
  ::Naive_vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*>>>
              *)local_168,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &cont2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,2,&local_39);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_188);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_178,0xfc,&local_188);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1b0,plVar3,(char (*) [1])0x1af121);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_1c8 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                ::size((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                        *)local_168);
    rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_1b0,&local_1c0,0xfc,1,2,&local_1c8,"col.size()",
               (undefined1 *)
               ((long)&rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&rowCol.entryPool_);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*>>>
  ::
  Naive_vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<int,std::allocator<int>>>
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*>>>
              *)local_220,2,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,2,
             (vector<int,_std::allocator<int>_> *)&rowCol.entryPool_,&local_39);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_240);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_230,0x100,&local_240);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_268,plVar3,(char (*) [1])0x1af121);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_280 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                ::size((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                        *)local_220);
    copyCol.entryPool_._4_4_ = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_268,&local_278,0x100,1,2,&local_280,"rowCol.size()",
               (undefined1 *)((long)&copyCol.entryPool_ + 4),"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_268);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_2c0,
             (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_168,(Column_settings *)0x0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2d0,0x103,&local_2e0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_308,plVar3,(char (*) [1])0x1af121);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_318,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_320 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                ::size((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                        *)local_2c0);
    rowCopyCol.entryPool_._4_4_ = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_308,&local_318,0x103,1,2,&local_320,"copyCol.size()",
               (undefined1 *)((long)&rowCopyCol.entryPool_ + 4),"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_308);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*>>>
  ::Naive_vector_column<std::vector<int,std::allocator<int>>>
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*>>>
              *)local_360,
             (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_220,4,(vector<int,_std::allocator<int>_> *)&rowCol.entryPool_,
             (Column_settings *)0x0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_370,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_380);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_370,0x106,&local_380);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3a8,plVar3,(char (*) [1])0x1af121);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_3c0 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                ::size((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                        *)local_360);
    moveCol.entryPool_._4_4_ = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_3a8,&local_3b8,0x106,1,2,&local_3c0,"rowCopyCol.size()",
               (undefined1 *)((long)&moveCol.entryPool_ + 4),"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_400,
             (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_168);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_410,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_420);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_410,0x109,&local_420);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_448,plVar3,(char (*) [1])0x1af121);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_458,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_460 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                ::size((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                        *)local_400);
    local_464 = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_448,&local_458,0x109,1,2,&local_460,"moveCol.size()",&local_464,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_448);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_478,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_488);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_478,0x10a,&local_488);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4b0,plVar3,(char (*) [1])0x1af121);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_4c8 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                ::size((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                        *)local_168);
    local_4cc = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_4b0,&local_4c0,0x10a,1,2,&local_4c8,"col.size()",&local_4cc,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_4b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4e0,0x10b,&local_4f0);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
    ::get_content(&local_530,
                  (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                   *)local_2c0,-1);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
    ::get_content(&local_558,
                  (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                   *)local_400,-1);
    bVar2 = std::operator==(&local_530,&local_558);
    boost::test_tools::assertion_result::assertion_result(&local_508,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_588,"copyCol.get_content() == moveCol.get_content()",0x2e);
    boost::unit_test::operator<<(&local_578,plVar3,&local_588);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&assignCol.entryPool_,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion
              (&local_508,&local_578,&assignCol.entryPool_,0x10b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_578);
    boost::test_tools::assertion_result::~assertion_result(&local_508);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_558);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_530);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_5d0,
             (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_2c0,(Column_settings *)0x0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5e0,0x10e,&local_5f0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_618,plVar3,(char (*) [1])0x1af121);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_628,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_630 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                ::size((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                        *)local_5d0);
    local_634 = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_618,&local_628,0x10e,1,2,&local_630,"assignCol.size()",&local_634,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_618);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::swap
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_2c0,
             (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_220);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_648,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_658);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_648,0x111,&local_658);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_680,plVar3,(char (*) [1])0x1af121);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_690,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_698 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                ::size((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                        *)local_2c0);
    local_69c = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_680,&local_690,0x111,1,2,&local_698,"copyCol.size()",&local_69c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_680);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6b0,0x112,&local_6c0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_6e8,plVar3,(char (*) [1])0x1af121);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_700 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                ::size((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                        *)local_220);
    local_704 = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_6e8,&local_6f8,0x112,1,2,&local_700,"rowCol.size()",&local_704,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_6e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_718,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_728);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_718,0x113,&local_728);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
    ::get_content(&local_768,
                  (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                   *)local_2c0,-1);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
    ::get_content(&local_790,
                  (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                   *)local_360,-1);
    bVar2 = std::operator==(&local_768,&local_790);
    boost::test_tools::assertion_result::assertion_result(&local_740,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7c0,"copyCol.get_content() == rowCopyCol.get_content()",0x31);
    boost::unit_test::operator<<(&local_7b0,plVar3,&local_7c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_740,&local_7b0,&local_7d0,0x113,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7b0);
    boost::test_tools::assertion_result::~assertion_result(&local_740);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_790);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_768);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_7e0,0x114,&local_7f0);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
    ::get_content(&local_830,
                  (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                   *)local_220,-1);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
    ::get_content(&local_858,
                  (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
                   *)local_5d0,-1);
    bVar2 = std::operator==(&local_830,&local_858);
    boost::test_tools::assertion_result::assertion_result(&local_808,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_888,"rowCol.get_content() == assignCol.get_content()",0x2f);
    boost::unit_test::operator<<(&local_878,plVar3,&local_888);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_898,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_808,&local_878,&local_898,0x114,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_878);
    boost::test_tools::assertion_result::~assertion_result(&local_808);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_858);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_830);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_8a8,0x116,&local_8b8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_8e0,plVar3,(char (*) [1])0x1af121);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_8f8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&rowCol.entryPool_);
    local_8fc = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_8e0,&local_8f0,0x116,1,2,&local_8f8,"rows.size()",&local_8fc,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_8e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_5d0);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_400);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_360);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_2c0);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_220);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&rowCol.entryPool_);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_168);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &cont2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void column_test_common_constructors() {
  using entry_type = typename std::conditional<is_z2<Column>(),
                                               unsigned int,
                                               std::pair<unsigned int, typename Column::Field_element>
                                              >::type;
  using Container = std::vector<entry_type>;

  Container cont1, cont2;
  typename Column::Column_settings settings(5);

  if constexpr (is_z2<Column>()) {
    cont1 = {0, 2, 4};
    cont2 = {0, 5, 6};
  } else {
    cont1 = {{0, 1u}, {2, 2u}, {4, 3u}};
    cont2 = {{0, 1u}, {5, 2u}, {6, 3u}};
  }

  Column emptyCol(&settings);
  BOOST_CHECK_EQUAL(emptyCol.size(), 0);

  Column col(cont1, 2, &settings);
  BOOST_CHECK_EQUAL(col.size(), 3);

  std::vector<int> rows;  // type doesn't matter, as the row option is not enabled.
  Column rowCol(2, cont2, 2, &rows, &settings);
  BOOST_CHECK_EQUAL(rowCol.size(), 3);

  Column copyCol(col);
  BOOST_CHECK_EQUAL(copyCol.size(), 3);

  Column rowCopyCol(rowCol, 4, &rows);
  BOOST_CHECK_EQUAL(rowCopyCol.size(), 3);

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 3);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(copyCol.get_content() == moveCol.get_content());

  Column assignCol = copyCol;
  BOOST_CHECK_EQUAL(assignCol.size(), 3);

  swap(copyCol, rowCol);
  BOOST_CHECK_EQUAL(copyCol.size(), 3);
  BOOST_CHECK_EQUAL(rowCol.size(), 3);
  BOOST_CHECK(copyCol.get_content() == rowCopyCol.get_content());
  BOOST_CHECK(rowCol.get_content() == assignCol.get_content());

  BOOST_CHECK_EQUAL(rows.size(), 0);
}